

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

_Bool attempt_shield_bash(player *p,monster *mon,_Bool *fear)

{
  short sVar1;
  _Bool _Var2;
  int16_t iVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  object *poVar9;
  object *obj;
  object *poVar10;
  wchar_t local_7c;
  int local_4c;
  wchar_t bash_chance;
  wchar_t energy_lost;
  wchar_t bash_dam;
  wchar_t bash_quality;
  wchar_t nblows;
  object *shield;
  object *weapon;
  _Bool *fear_local;
  monster *mon_local;
  player *p_local;
  
  wVar4 = slot_by_name(p,"weapon");
  poVar9 = slot_object(p,wVar4);
  wVar4 = slot_by_name(p,"arm");
  obj = slot_object(p,wVar4);
  wVar4 = (p->state).num_blows;
  local_4c = (p->state).skills[6] / 8 + adj_dex_th[(p->state).stat_ind[3]] / 2;
  if (obj == (object *)0x0) {
    p_local._7_1_ = false;
  }
  else if (mon->race->level < (int)p->lev / 2) {
    p_local._7_1_ = false;
  }
  else {
    poVar10 = equipped_item_by_slot_name(p,"weapon");
    if (poVar10 == (object *)0x0) {
      local_4c = local_4c * 4;
    }
    else {
      iVar6 = (uint)poVar9->dd * (uint)poVar9->ds * (wVar4 / 100);
      iVar7 = (uint)obj->dd * (uint)obj->ds;
      if (SBORROW4(iVar6,iVar7 * 3) != iVar6 + iVar7 * -3 < 0) {
        local_4c = local_4c * 2;
      }
    }
    uVar5 = Rand_div(mon->race->level + L'È');
    if ((int)uVar5 < local_4c) {
      iVar6 = (p->state).skills[6];
      sVar1 = p->wt;
      wVar4 = p->upkeep->total_weight;
      iVar3 = object_weight_one(obj);
      iVar6 = iVar6 / 4 + (int)sVar1 / 8 + wVar4 / 0x50 + (int)iVar3 / 2;
      iVar7 = damroll((uint)obj->dd,(uint)obj->ds);
      local_7c = adj_str_td[(p->state).stat_ind[0]] + (iVar6 / 0x28 + (int)p->lev / 0xe) * iVar7;
      if (local_7c < L'\x01') {
        p_local._7_1_ = false;
      }
      else {
        if (L'}' < local_7c) {
          local_7c = L'}';
        }
        if (((p->opts).opt[3] & 1U) == 0) {
          msgt(2,"You get in a shield bash!",(long)(int)p->lev % 0xe & 0xffffffff);
        }
        else {
          msgt(2,"You get in a shield bash! (%d)",(ulong)(uint)local_7c);
        }
        uVar5 = Rand_div(local_7c);
        uVar8 = Rand_div(local_7c / 2);
        if ((int)(uVar8 + 0x1f) < (int)(uVar5 + 1)) {
          msgt(0x91,"WHAMM!");
        }
        _Var2 = mon_take_hit(mon,p,local_7c,fear,(char *)0x0);
        if (_Var2) {
          p_local._7_1_ = true;
        }
        else {
          sVar1 = p->lev;
          uVar5 = Rand_div(mon->race->level * 8 + 200);
          if ((int)(uVar5 + 1) < iVar6 + sVar1) {
            uVar5 = Rand_div((int)p->lev / 5);
            mon_inc_timed(mon,L'\x01',uVar5 + L'\x04',L'\0');
          }
          sVar1 = p->lev;
          uVar5 = Rand_div(mon->race->level * 0xc + 300);
          if ((int)(uVar5 + 1) < iVar6 + sVar1) {
            uVar5 = Rand_div((int)p->lev / 5);
            mon_inc_timed(mon,L'\x02',uVar5 + L'\x04',L'\0');
          }
          iVar6 = adj_dex_th[(p->state).stat_ind[3]];
          uVar5 = Rand_div(0x3c);
          if (iVar6 + 0x23 < (int)(uVar5 + 1)) {
            uVar5 = Rand_div(0x32);
            msgt(0,"You stumble!");
            p->upkeep->energy_use =
                 (int)((uVar5 + 0x1a) * (uint)z_info->move_energy) / 100 + p->upkeep->energy_use;
          }
          p_local._7_1_ = false;
        }
      }
    }
    else {
      p_local._7_1_ = false;
    }
  }
  return p_local._7_1_;
}

Assistant:

static bool attempt_shield_bash(struct player *p, struct monster *mon, bool *fear)
{
	struct object *weapon = slot_object(p, slot_by_name(p, "weapon"));
	struct object *shield = slot_object(p, slot_by_name(p, "arm"));
	int nblows = p->state.num_blows / 100;
	int bash_quality, bash_dam, energy_lost;

	/* Bashing chance depends on melee skill, DEX, and a level bonus. */
	int bash_chance = p->state.skills[SKILL_TO_HIT_MELEE] / 8 +
		adj_dex_th[p->state.stat_ind[STAT_DEX]] / 2;

	/* No shield, no bash */
	if (!shield) return false;

	/* Monster is too pathetic, don't bother */
	if (mon->race->level < p->lev / 2) return false;

	/* Players bash more often when they see a real need: */
	if (!equipped_item_by_slot_name(p, "weapon")) {
		/* Unarmed... */
		bash_chance *= 4;
	} else if (weapon->dd * weapon->ds * nblows < shield->dd * shield->ds * 3) {
		/* ... or armed with a puny weapon */
		bash_chance *= 2;
	}

	/* Try to get in a shield bash. */
	if (bash_chance <= randint0(200 + mon->race->level)) {
		return false;
	}

	/* Calculate attack quality, a mix of momentum and accuracy. */
	bash_quality = p->state.skills[SKILL_TO_HIT_MELEE] / 4 + p->wt / 8 +
		p->upkeep->total_weight / 80 + object_weight_one(shield) / 2;

	/* Calculate damage.  Big shields are deadly. */
	bash_dam = damroll(shield->dd, shield->ds);

	/* Multiply by quality and experience factors */
	bash_dam *= bash_quality / 40 + p->lev / 14;

	/* Strength bonus. */
	bash_dam += adj_str_td[p->state.stat_ind[STAT_STR]];

	/* Paranoia. */
	if (bash_dam <= 0) return false;
	bash_dam = MIN(bash_dam, 125);

	if (OPT(p, show_damage)) {
		msgt(MSG_HIT, "You get in a shield bash! (%d)", bash_dam);
	} else {
		msgt(MSG_HIT, "You get in a shield bash!");
	}

	/* Encourage the player to keep wearing that heavy shield. */
	if (randint1(bash_dam) > 30 + randint1(bash_dam / 2)) {
		msgt(MSG_HIT_HI_SUPERB, "WHAMM!");
	}

	/* Damage, check for fear and death. */
	if (mon_take_hit(mon, p, bash_dam, fear, NULL)) return true;

	/* Stunning. */
	if (bash_quality + p->lev > randint1(200 + mon->race->level * 8)) {
		mon_inc_timed(mon, MON_TMD_STUN, randint0(p->lev / 5) + 4, 0);
	}

	/* Confusion. */
	if (bash_quality + p->lev > randint1(300 + mon->race->level * 12)) {
		mon_inc_timed(mon, MON_TMD_CONF, randint0(p->lev / 5) + 4, 0);
	}

	/* The player will sometimes stumble. */
	if (35 + adj_dex_th[p->state.stat_ind[STAT_DEX]] < randint1(60)) {
		energy_lost = randint1(50) + 25;
		/* Lose 26-75% of a turn due to stumbling after shield bash. */
		msgt(MSG_GENERIC, "You stumble!");
		p->upkeep->energy_use += energy_lost * z_info->move_energy / 100;
	}

	return false;
}